

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain_struct
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  char *pcVar1;
  uint uVar2;
  pointer pcVar3;
  bool bVar4;
  uint32_t uVar5;
  SPIRType *type;
  SPIRType *pSVar6;
  uint32_t index;
  ulong uVar7;
  ulong uVar8;
  SmallVector<unsigned_int,_8UL> subcomposite_chain;
  SmallVector<unsigned_int,_8UL> local_118;
  undefined1 local_d8 [24];
  _Alloc_hider local_c0;
  char local_b0 [16];
  _Alloc_hider local_a0;
  char local_90 [16];
  int local_80;
  VariableID VStack_7c;
  undefined8 uStack_78;
  ushort local_70;
  undefined1 local_68 [56];
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(chain->super_IVariant).field_0xc);
  uVar7 = (ulong)(uint)(type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  local_d8._8_4_ = (chain->super_IVariant).self.id;
  local_d8._0_8_ = &PTR__SPIRAccessChain_0049df50;
  local_d8._12_8_ = *(undefined8 *)&(chain->super_IVariant).field_0xc;
  local_c0._M_p = local_b0;
  pcVar3 = (chain->base)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar3,pcVar3 + (chain->base)._M_string_length);
  local_a0._M_p = local_90;
  pcVar3 = (chain->dynamic_index)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar3,pcVar3 + (chain->dynamic_index)._M_string_length);
  local_70._0_1_ = chain->row_major_matrix;
  local_70._1_1_ = chain->immutable;
  local_80 = chain->static_index;
  VStack_7c.id = (chain->loaded_from).id;
  uStack_78._0_4_ = chain->matrix_stride;
  uStack_78._4_4_ = chain->array_stride;
  local_68._0_8_ = local_68 + 0x18;
  local_68._8_8_ = 0;
  local_68._16_8_ = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)local_68,
             &chain->implied_read_expressions);
  local_118.super_VectorView<unsigned_int>.ptr = (uint *)&local_118.stack_storage;
  local_118.super_VectorView<unsigned_int>.buffer_size = 0;
  local_118.buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=(&local_118,composite_chain);
  SmallVector<unsigned_int,_8UL>::reserve
            (&local_118,local_118.super_VectorView<unsigned_int>.buffer_size + 1);
  pcVar1 = (char *)local_118.super_VectorView<unsigned_int>.ptr +
           local_118.super_VectorView<unsigned_int>.buffer_size * 4;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  local_118.super_VectorView<unsigned_int>.buffer_size =
       local_118.super_VectorView<unsigned_int>.buffer_size + 1;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      index = (uint32_t)uVar8;
      uVar5 = Compiler::type_struct_member_offset((Compiler *)this,type,index);
      local_80 = uVar5 + chain->static_index;
      uVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              ptr[uVar8].id;
      local_d8._12_4_ = uVar2;
      local_70 = local_70 & 0xff00;
      uStack_78._0_4_ = 0;
      uStack_78._4_4_ = 0;
      pSVar6 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + uVar2);
      if (1 < pSVar6->columns) {
        uVar5 = Compiler::type_struct_member_matrix_stride((Compiler *)this,type,index);
        uStack_78._0_4_ = uVar5;
        bVar4 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                           DecorationRowMajor);
        local_70 = CONCAT11(local_70._1_1_,bVar4);
      }
      if ((pSVar6->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        uVar5 = Compiler::type_struct_member_array_stride((Compiler *)this,type,index);
        uStack_78._4_4_ = uVar5;
      }
      *(uint32_t *)
       ((char *)local_118.super_VectorView<unsigned_int>.ptr +
       local_118.super_VectorView<unsigned_int>.buffer_size * 4 + -4) = index;
      write_access_chain(this,(SPIRAccessChain *)local_d8,value,&local_118);
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  local_118.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_118.super_VectorView<unsigned_int>.ptr !=
      &local_118.stack_storage) {
    free(local_118.super_VectorView<unsigned_int>.ptr);
  }
  local_d8._0_8_ = &PTR__SPIRAccessChain_0049df50;
  local_68._8_8_ = 0;
  if ((TypedID<(spirv_cross::Types)0> *)local_68._0_8_ !=
      (TypedID<(spirv_cross::Types)0> *)(local_68 + 0x18)) {
    free((void *)local_68._0_8_);
  }
  if (local_a0._M_p != local_90) {
    operator_delete(local_a0._M_p);
  }
  if (local_c0._M_p != local_b0) {
    operator_delete(local_c0._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::write_access_chain_struct(const SPIRAccessChain &chain, uint32_t value,
                                             const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);
	uint32_t member_count = uint32_t(type.member_types.size());
	auto subchain = chain;

	auto subcomposite_chain = composite_chain;
	subcomposite_chain.push_back(0);

	for (uint32_t i = 0; i < member_count; i++)
	{
		uint32_t offset = type_struct_member_offset(type, i);
		subchain.static_index = chain.static_index + offset;
		subchain.basetype = type.member_types[i];

		subchain.matrix_stride = 0;
		subchain.array_stride = 0;
		subchain.row_major_matrix = false;

		auto &member_type = get<SPIRType>(subchain.basetype);
		if (member_type.columns > 1)
		{
			subchain.matrix_stride = type_struct_member_matrix_stride(type, i);
			subchain.row_major_matrix = has_member_decoration(type.self, i, DecorationRowMajor);
		}

		if (!member_type.array.empty())
			subchain.array_stride = type_struct_member_array_stride(type, i);

		subcomposite_chain.back() = i;
		write_access_chain(subchain, value, subcomposite_chain);
	}
}